

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

t_root * __thiscall xemmai::t_root::operator=(t_root *this,t_root *a_value)

{
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *__p;
  __pointer_type ptVar1;
  long *in_FS_OFFSET;
  t_root *a_value_local;
  t_root *this_local;
  __pointer_type p;
  
  __p = xemmai::t_slot::operator_cast_to_t_object_(&a_value->super_t_slot);
  if ((t_object *)0x4 < __p) {
    this_00 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
    *this_00->v_head = __p;
    if (this_00->v_head == this_00->v_next) {
      xemmai::t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  ptVar1 = std::atomic<xemmai::t_object_*>::exchange((atomic<xemmai::t_object_*> *)this,__p,relaxed)
  ;
  if ((__pointer_type)0x4 < ptVar1) {
    this_01 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar1;
    if (this_01->v_head == this_01->v_next) {
      xemmai::t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  return this;
}

Assistant:

t_root& operator=(const t_root& a_value)
	{
		static_cast<t_slot&>(*this) = a_value;
		return *this;
	}